

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 *y_00;
  int *comp_00;
  stbi__uint32 b;
  stbi__uint32 c;
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  stbi__uint16 *psVar5;
  uchar *puVar6;
  int iVar7;
  long in_FS_OFFSET;
  
  y_00 = &s->img_y;
  comp_00 = &s->img_n;
  iVar3 = req_comp;
  iVar1 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
  ri->bits_per_channel = iVar1;
  if (iVar1 != 0) {
    if ((*y_00 < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      *y = *y_00;
      if (comp != (int *)0x0) {
        *comp = *comp_00;
      }
      iVar1 = s->img_n;
      b = s->img_x;
      c = s->img_y;
      iVar2 = ri->bits_per_channel;
      iVar7 = iVar2 + 7;
      if (-1 < iVar2) {
        iVar7 = iVar2;
      }
      iVar7 = iVar7 >> 3;
      iVar2 = stbi__mad4sizes_valid(iVar1,b,c,iVar7,iVar3);
      if (iVar2 == 0) {
        pcVar4 = "PNM too large";
      }
      else {
        psVar5 = (stbi__uint16 *)stbi__malloc_mad4(iVar1,b,c,iVar7,iVar3);
        if (psVar5 == (stbi__uint16 *)0x0) {
          pcVar4 = "Out of memory";
        }
        else {
          iVar3 = stbi__getn(s,(stbi_uc *)psVar5,b * iVar1 * c * iVar7);
          if (iVar3 != 0) {
            if (req_comp == 0) {
              return psVar5;
            }
            iVar3 = *comp_00;
            if (iVar3 == req_comp) {
              return psVar5;
            }
            if (ri->bits_per_channel != 0x10) {
              puVar6 = stbi__convert_format((uchar *)psVar5,iVar3,req_comp,s->img_x,s->img_y);
              return puVar6;
            }
            psVar5 = stbi__convert_format16(psVar5,iVar3,req_comp,s->img_x,s->img_y);
            return psVar5;
          }
          free(psVar5);
          pcVar4 = "PNM file truncated";
        }
      }
    }
    else {
      pcVar4 = "Very large image (corrupt?)";
    }
    *(char **)(in_FS_OFFSET + -0x20) = pcVar4;
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   ri->bits_per_channel = stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n);
   if (ri->bits_per_channel == 0)
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad4sizes_valid(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad4(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   if (!stbi__getn(s, out, s->img_n * s->img_x * s->img_y * (ri->bits_per_channel / 8))) {
      STBI_FREE(out);
      return stbi__errpuc("bad PNM", "PNM file truncated");
   }

   if (req_comp && req_comp != s->img_n) {
      if (ri->bits_per_channel == 16) {
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, s->img_n, req_comp, s->img_x, s->img_y);
      } else {
         out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      }
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}